

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny-format.hh
# Opt level: O3

string * __thiscall
tinyusdz::fmt::format<int,std::__cxx11::string>
          (string *__return_storage_ptr__,fmt *this,string *in,int *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ostringstream ss;
  anon_union_32_2_293c120a_for_storage_t_impl<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_2
  local_1e8;
  char local_1c8;
  long *local_1c0 [2];
  long local_1b0 [2];
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  ios_base local_130 [264];
  
  detail::tokenize((expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1e8.m_value,(string *)this);
  if (local_1c8 == '\0') {
    local_1c0[0] = local_1b0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c0,*(long *)this,*(long *)(this + 8) + *(long *)this);
    ::std::__cxx11::string::append((char *)local_1c0);
    if (local_1c8 == '\x01') {
      __assert_fail("! has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/expected.hpp"
                    ,0x881,
                    "error_type &nonstd::expected_lite::expected<std::vector<std::basic_string<char>>, std::basic_string<char>>::error() & [T = std::vector<std::basic_string<char>>, E = std::basic_string<char>]"
                   );
    }
    plVar2 = (long *)::std::__cxx11::string::_M_append
                               ((char *)local_1c0,
                                (ulong)local_1e8.m_value.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_190 = *plVar3;
      lStack_188 = plVar2[3];
      local_1a0 = &local_190;
    }
    else {
      local_190 = *plVar3;
      local_1a0 = (long *)*plVar2;
    }
    local_198 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)::std::__cxx11::string::append((char *)&local_1a0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar4) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,local_190 + 1);
    }
    if (local_1c0[0] != local_1b0) {
      operator_delete(local_1c0[0],local_1b0[0] + 1);
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    if (local_1c8 == '\0') {
      __assert_fail("has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/expected.hpp"
                    ,0x83f,
                    "value_type &nonstd::expected_lite::expected<std::vector<std::basic_string<char>>, std::basic_string<char>>::operator*() & [T = std::vector<std::basic_string<char>>, E = std::basic_string<char>]"
                   );
    }
    detail::format_sv_rec<int,std::__cxx11::string>
              ((ostringstream *)&local_1a0,&local_1e8.m_value,0,(int *)in,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
    ::std::ios_base::~ios_base(local_130);
  }
  nonstd::expected_lite::
  expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~expected((expected<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_1e8.m_value);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const std::string &in, Args const &...args) {
  auto ret = detail::tokenize(in);
  if (!ret) {
    return in + "(format error: " + ret.error() + ")";
  }

  std::ostringstream ss;
  detail::format_sv(ss, (*ret), args...);

  return ss.str();
}